

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_subroutine_body(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"{",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"parameter list",&local_62)
  ;
  check_expected_x_after_y(this,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t<symbol>{</symbol>");
  std::endl<char,std::char_traits<char>>(poVar2);
  query_tokenizer(this);
  while( true ) {
    bVar1 = std::operator==(&this->cur_token,"var");
    if (!bVar1) break;
    parse_var_dec(this);
  }
  parse_statements(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"}",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"statement(s)",&local_62);
  check_expected_x_after_y(this,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_40,"\t\t<symbol>",&this->cur_token);
  std::operator+(&local_60,&local_40,"</symbol>");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  query_tokenizer(this);
  return;
}

Assistant:

void Parser::parse_subroutine_body() {
    check_expected_x_after_y("{", "parameter list");

    out_file << "\t\t<symbol>{</symbol>" << std::endl;
    query_tokenizer();

   while (cur_token == "var") {
        parse_var_dec();
    }
    parse_statements();

    check_expected_x_after_y("}", "statement(s)");
    out_file << "\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

}